

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall pugi::xml_node::append_copy(xml_node *this,xml_node *proto)

{
  ulong uVar1;
  xml_allocator *this_00;
  xml_node xVar2;
  xml_node_struct *pxVar3;
  uint uVar4;
  uint uVar5;
  xml_node n;
  xml_node local_28;
  xml_node local_20;
  
  if (proto->_root == (xml_node_struct *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (uint)proto->_root->header & 0xf;
  }
  pxVar3 = this->_root;
  if ((pxVar3 == (xml_node_struct *)0x0) || (uVar5 < 2)) goto LAB_00181496;
  uVar4 = (uint)pxVar3->header & 0xf;
  if ((uVar4 - 3 < 0xfffffffe) || (0xfffffffd < uVar5 - 9 && uVar4 != 1)) goto LAB_00181496;
  this_00 = *(xml_allocator **)((long)pxVar3 - (pxVar3->header >> 8));
  uVar1 = this_00->_busy_size + 0x40;
  if (uVar1 < 0x7fd9) {
    pxVar3 = (xml_node_struct *)
             ((long)&((xml_node_struct *)this_00->_root)->prev_sibling_c + this_00->_busy_size);
    this_00->_busy_size = uVar1;
    xVar2._root = (xml_node_struct *)this_00->_root;
LAB_00181435:
    pxVar3->prev_sibling_c = (xml_node_struct *)0x0;
    pxVar3->next_sibling = (xml_node_struct *)0x0;
    pxVar3->parent = (xml_node_struct *)0x0;
    pxVar3->first_child = (xml_node_struct *)0x0;
    pxVar3->name = (char_t *)0x0;
    pxVar3->value = (char_t *)0x0;
    pxVar3->first_attribute = (xml_attribute_struct *)0x0;
    pxVar3->header = (ulong)uVar5 | ((long)pxVar3 - (long)xVar2._root) * 0x100;
  }
  else {
    pxVar3 = (xml_node_struct *)
             impl::anon_unknown_0::xml_allocator::allocate_memory_oob
                       (this_00,0x40,(xml_memory_page **)&local_20);
    xVar2._root = local_20._root;
    if (pxVar3 != (xml_node_struct *)0x0) goto LAB_00181435;
    pxVar3 = (xml_node_struct *)0x0;
  }
  xml_node(&local_20,pxVar3);
  if (local_20._root != (xml_node_struct *)0x0) {
    pxVar3 = this->_root;
    (local_20._root)->parent = pxVar3;
    xVar2._root = pxVar3->first_child;
    if (xVar2._root == (xml_node_struct *)0x0) {
      pxVar3->first_child = local_20._root;
      xVar2._root = local_20._root;
    }
    else {
      pxVar3 = (xVar2._root)->prev_sibling_c;
      pxVar3->next_sibling = local_20._root;
      (local_20._root)->prev_sibling_c = pxVar3;
    }
    (xVar2._root)->prev_sibling_c = local_20._root;
    impl::anon_unknown_0::node_copy_tree(local_20._root,proto->_root);
    return (xml_node)local_20._root;
  }
LAB_00181496:
  xml_node(&local_28);
  return (xml_node)local_28._root;
}

Assistant:

PUGI__FN xml_node xml_node::append_copy(const xml_node& proto)
	{
		xml_node_type type_ = proto.type();
		if (!impl::allow_insert_child(type(), type_)) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		xml_node n(impl::allocate_node(alloc, type_));
		if (!n) return xml_node();

		impl::append_node(n._root, _root);
		impl::node_copy_tree(n._root, proto._root);

		return n;
	}